

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O1

void draw_msgwin(void)

{
  bool bVar1;
  bool bVar2;
  WINDOW *pWVar3;
  uint uVar4;
  attr_t aVar5;
  wchar_t wVar6;
  int iVar7;
  wchar_t wVar8;
  
  if (msgwin == (WINDOW *)0x0) {
    iVar7 = -2;
  }
  else {
    iVar7 = (int)msgwin->_maxy;
  }
  if (-1 < iVar7) {
    bVar2 = false;
    do {
      pWVar3 = msgwin;
      if (msgwin == (WINDOW *)0x0) {
        uVar4 = 1;
      }
      else {
        uVar4 = ~(int)msgwin->_maxy;
      }
      wVar6 = iVar7 + uVar4 + curline + L'\x01';
      wVar8 = iVar7 + 0x29 + uVar4 + curline;
      if (L'\xffffffff' < wVar6) {
        wVar8 = wVar6;
      }
      if ((wVar8 == start_of_turn_curline) && (bVar2 = true, settings.darkmsg != '\0')) {
        aVar5 = curses_color_attr(4,0);
        wattr_on(pWVar3,aVar5,0);
      }
      wmove(msgwin,iVar7,0);
      waddnstr(msgwin,msglines + wVar8,0xffffffff);
      if (((msgwin == (WINDOW *)0x0) || (msgwin->_curx != 0)) || (msglines[wVar8][0] == '\0')) {
        wclrtoeol();
      }
      pWVar3 = msgwin;
      bVar1 = 0 < iVar7;
      iVar7 = iVar7 + -1;
    } while (bVar1);
    if (bVar2) {
      if (settings.darkmsg != '\0') {
        aVar5 = curses_color_attr(4,0);
        wattr_off(pWVar3,aVar5,0);
      }
      goto LAB_0010e6dd;
    }
  }
  start_of_turn_curline = L'\xffffffff';
LAB_0010e6dd:
  wnoutrefresh(msgwin);
  return;
}

Assistant:

void draw_msgwin(void)
{
    int i, pos;
    nh_bool drew_older = FALSE;

    for (i = getmaxy(msgwin) - 1; i >= 0; i--) {
	pos = curline - getmaxy(msgwin) + 1 + i;
	if (pos < 0)
	    pos += MAX_MSGLINES;
	if (pos == start_of_turn_curline) {
	    if (settings.darkmsg)
		wattron(msgwin, curses_color_attr(CLR_BLUE, 0));
	    drew_older = TRUE;
	}
	wmove(msgwin, i, 0);
	waddstr(msgwin, msglines[pos]);
	/* Only clear the remainder of the line if the cursor did not wrap. */
	if (getcurx(msgwin) || !*msglines[pos])
	    wclrtoeol(msgwin);
    }

    if (drew_older) {
	if (settings.darkmsg)
	    wattroff(msgwin, curses_color_attr(CLR_BLUE, 0));
    } else {
	/* Don't dim out messages if the message buffer wraps. */
	start_of_turn_curline = -1;
    }

    wnoutrefresh(msgwin);
}